

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  size_t sVar1;
  int iVar2;
  char *val;
  bool bVar3;
  double dVar4;
  char *end;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
  sVar1 = (arg->Value)._M_string_length;
  if (sVar1 == local_40) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((arg->Value)._M_dataplus._M_p,local_48,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (!bVar3) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1","");
    sVar1 = (arg->Value)._M_string_length;
    if (sVar1 == local_40) {
      if (sVar1 == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((arg->Value)._M_dataplus._M_p,local_48,sVar1);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if (bVar3) {
      return true;
    }
    bVar3 = cmSystemTools::IsOn((arg->Value)._M_dataplus._M_p);
    if (bVar3) {
      return true;
    }
    bVar3 = cmSystemTools::IsOff((arg->Value)._M_dataplus._M_p);
    if (!bVar3) {
      if (((arg->Value)._M_string_length != 0) &&
         (dVar4 = strtod((arg->Value)._M_dataplus._M_p,(char **)&local_48), (char)*local_48 == '\0')
         ) {
        return (bool)(-(dVar4 != 0.0) & 1);
      }
      val = GetDefinitionIfUnquoted(this,arg);
      bVar3 = cmSystemTools::IsOff(val);
      return !bVar3;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic constants.
  if (arg == "0")
    {
    return false;
    }
  if (arg == "1")
    {
    return true;
    }

  // Check named constants.
  if (cmSystemTools::IsOn(arg.c_str()))
    {
    return true;
    }
  if (cmSystemTools::IsOff(arg.c_str()))
    {
    return false;
    }

  // Check for numbers.
  if(!arg.empty())
    {
    char* end;
    double d = strtod(arg.c_str(), &end);
    if(*end == '\0')
      {
      // The whole string is a number.  Use C conversion to bool.
      return d? true:false;
      }
    }

  // Check definition.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  return !cmSystemTools::IsOff(def);
}